

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::FragmentDataLocationAPITest::prepareFramebuffer
          (FragmentDataLocationAPITest *this,Framebuffer *framebuffer,Texture *color_0_texture)

{
  int iVar1;
  deUint32 err;
  size_type sVar2;
  reference pvVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  int local_68;
  int local_64;
  GLenum buffers [4];
  GLint buffers_size;
  Functions *gl;
  GLuint i;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  Texture *color_0_texture_local;
  Framebuffer *framebuffer_local;
  FragmentDataLocationAPITest *this_local;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &color_0_texture->m_id;
  TextureTestBase::prepareFramebuffer(&this->super_TextureTestBase,framebuffer,color_0_texture);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0x100);
  gl._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    if (sVar2 <= (uint)gl) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,
                        (ulong)(uint)gl);
    *pvVar3 = 0x20406080;
    gl._0_4_ = (uint)gl + 1;
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  Utils::Texture::Init(&this->m_goku,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,pvVar3);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  Utils::Texture::Init(&this->m_gohan,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,pvVar3);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  Utils::Texture::Init(&this->m_goten,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,pvVar3);
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  Utils::Texture::Init(&this->m_chichi,TEX_2D,0x10,0x10,0,0x8058,0x1908,0x1401,pvVar3);
  Utils::Framebuffer::Bind(framebuffer);
  Utils::Framebuffer::AttachTexture
            (framebuffer,this->m_goku_location + 0x8ce0,(this->m_goku).m_id,0x10,0x10);
  Utils::Framebuffer::AttachTexture
            (framebuffer,this->m_gohan_location + 0x8ce0,(this->m_gohan).m_id,0x10,0x10);
  Utils::Framebuffer::AttachTexture(framebuffer,0x8ce6,(this->m_goten).m_id,0x10,0x10);
  Utils::Framebuffer::AttachTexture
            (framebuffer,this->m_chichi_location + 0x8ce0,(this->m_chichi).m_id,0x10,0x10);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  buffers[3] = 4;
  local_68 = this->m_chichi_location + 0x8ce0;
  local_64 = this->m_goku_location + 0x8ce0;
  buffers[0] = 0x8ce6;
  buffers[1] = this->m_gohan_location + 0x8ce0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x560))(4,&local_68);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"DrawBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x4b76);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return;
}

Assistant:

void FragmentDataLocationAPITest::prepareFramebuffer(Utils::Framebuffer& framebuffer, Utils::Texture& color_0_texture)
{
	/* Let parent prepare its stuff */
	TextureTestBase::prepareFramebuffer(framebuffer, color_0_texture);

	/* Prepare data */
	std::vector<GLuint> texture_data;
	texture_data.resize(m_width * m_height);

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = 0x20406080;
	}

	/* Prepare textures */
	m_goku.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_gohan.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_goten.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	m_chichi.Init(Utils::Texture::TEX_2D, m_width, m_height, 0, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	/* Attach textures to framebuffer */
	framebuffer.Bind();
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_goku_location, m_goku.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_gohan_location, m_gohan.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_goten_location, m_goten.m_id, m_width, m_height);
	framebuffer.AttachTexture(GL_COLOR_ATTACHMENT0 + m_chichi_location, m_chichi.m_id, m_width, m_height);

	/* Set up drawbuffers */
	const Functions& gl = m_context.getRenderContext().getFunctions();
	//  1. There are only 4 outputs in fragment shader, so only need to do buffer mapping for 4 attachments,
	//  2. another issue is each output variable has a location, it is the fragment color index, so the index of
	//  GL_COLOR_ATTACHMENT in glDrawBuffers() should keep the same with the location, to make test correct,
	//  we needt to change the above code of glDrawBuffers() as :
	GLint  buffers_size = 4;
	GLenum buffers[]	= { GLenum(GL_COLOR_ATTACHMENT0 + m_chichi_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_goku_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_goten_location),
						 GLenum(GL_COLOR_ATTACHMENT0 + m_gohan_location) };
	gl.drawBuffers(buffers_size, buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawBuffers");
}